

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCproto * lj_parse(LexState *ls)

{
  lua_State *L_00;
  char *str;
  TValue *pTVar1;
  size_t lenx;
  GCstr *pGVar2;
  GCproto *pGVar3;
  lua_State *L;
  GCproto *pt;
  FuncScope bl;
  FuncState fs;
  LexState *ls_local;
  
  L_00 = ls->L;
  str = ls->chunkarg;
  lenx = strlen(ls->chunkarg);
  pGVar2 = lj_str_new(L_00,str,lenx);
  ls->chunkname = pGVar2;
  L_00->top->u64 = (ulong)ls->chunkname | 0xfffd800000000000;
  pTVar1 = L_00->top;
  L_00->top = pTVar1 + 1;
  if ((TValue *)(L_00->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L_00);
  }
  ls->level = 0;
  fs_init(ls,(FuncState *)&bl.vstart);
  fscope_begin((FuncState *)&bl.vstart,(FuncScope *)&pt,0);
  bcemit_INS((FuncState *)&bl.vstart,0x5c);
  lj_lex_next(ls);
  parse_chunk(ls);
  if (ls->tok != 0x121) {
    err_token(ls,0x121);
  }
  pGVar3 = fs_finish(ls,ls->linenumber);
  L_00->top = L_00->top + -1;
  return pGVar3;
}

Assistant:

GCproto *lj_parse(LexState *ls)
{
  FuncState fs;
  FuncScope bl;
  GCproto *pt;
  lua_State *L = ls->L;
#ifdef LUAJIT_DISABLE_DEBUGINFO
  ls->chunkname = lj_str_newlit(L, "=");
#else
  ls->chunkname = lj_str_newz(L, ls->chunkarg);
#endif
  setstrV(L, L->top, ls->chunkname);  /* Anchor chunkname string. */
  incr_top(L);
  ls->level = 0;
  fs_init(ls, &fs);
  fs.linedefined = 0;
  fs.numparams = 0;
  fs.bcbase = NULL;
  fs.bclim = 0;
  fs.flags |= PROTO_VARARG;  /* Main chunk is always a vararg func. */
  fscope_begin(&fs, &bl, 0);
  bcemit_AD(&fs, BC_FUNCV, 0, 0);  /* Placeholder. */
  lj_lex_next(ls);  /* Read-ahead first token. */
  parse_chunk(ls);
  if (ls->tok != TK_eof)
    err_token(ls, TK_eof);
  pt = fs_finish(ls, ls->linenumber);
  L->top--;  /* Drop chunkname. */
  lj_assertL(fs.prev == NULL && ls->fs == NULL, "mismatched frame nesting");
  lj_assertL(pt->sizeuv == 0, "toplevel proto has upvalues");
  return pt;
}